

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall ON_BezierCurve::SetCV(ON_BezierCurve *this,int i,point_style style,double *Point)

{
  double *__dest;
  double dVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  
  if (i < 0) {
    return false;
  }
  if (this->m_cv == (double *)0x0) {
    return false;
  }
  if (this->m_order <= i) {
    return false;
  }
  if (3 < style - not_rational) {
    return false;
  }
  __dest = this->m_cv + i * this->m_cv_stride;
  switch(style) {
  case not_rational:
    memcpy(__dest,Point,(long)this->m_dim << 3);
    if (this->m_is_rat != 0) {
      __dest[this->m_dim] = 1.0;
      return true;
    }
    return true;
  case homogeneous_rational:
    uVar2 = this->m_dim;
    if (this->m_is_rat == 0) {
      dVar1 = Point[(int)uVar2];
      uVar6 = -(ulong)(dVar1 != 0.0);
      uVar3 = 0;
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        __dest[uVar3] =
             Point[uVar3] * (double)(~uVar6 & 0x3ff0000000000000 | (ulong)(1.0 / dVar1) & uVar6);
      }
      return true;
    }
    __n = (long)(int)uVar2 * 8 + 8;
    goto LAB_003fa776;
  case euclidean_rational:
    uVar2 = this->m_dim;
    lVar4 = (long)(int)uVar2;
    if (this->m_is_rat != 0) {
      dVar1 = Point[lVar4];
      uVar3 = 0;
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        __dest[uVar3] = Point[uVar3] * dVar1;
      }
      __dest[lVar4] = dVar1;
      return true;
    }
    break;
  case intrinsic_point_style:
    lVar4 = ((long)this->m_dim + 1) - (ulong)(this->m_is_rat == 0);
  }
  __n = lVar4 << 3;
LAB_003fa776:
  memcpy(__dest,Point,__n);
  return true;
}

Assistant:

bool ON_BezierCurve::SetCV( int i, ON::point_style style, const double* Point )
{
  bool rc = true;
  int k;
  double w;

  // feeble but fast check for properly initialized class
  if ( !m_cv || i < 0 || i >= m_order )
    return false;

  double* cv = m_cv + i*m_cv_stride;

  switch ( style ) {

  case ON::not_rational:  // input Point is not rational
    memcpy( cv, Point, m_dim*sizeof(*cv) );
    if ( IsRational() ) {
      // NURBS curve is rational - set weight to one
      cv[m_dim] = 1.0;
    }
    break;

  case ON::homogeneous_rational:  // input Point is homogeneous rational
    if ( IsRational() ) {
      // NURBS curve is rational
      memcpy( cv, Point, (m_dim+1)*sizeof(*cv) );
    }
    else {
      // NURBS curve is not rational
      w = (Point[m_dim] != 0.0) ? 1.0/Point[m_dim] : 1.0;
      for ( k = 0; k < m_dim; k++ ) {
        cv[k] = w*Point[k];
      }
    }
    break;

  case ON::euclidean_rational:  // input Point is euclidean rational
    if ( IsRational() ) {
      // NURBS curve is rational - convert euclean point to homogeneous form
      w = Point[m_dim];
      for ( k = 0; k < m_dim; k++ )
        cv[k] = w*Point[k];
      cv[m_dim] = w;
    }
    else {
      // NURBS curve is not rational
      memcpy( cv, Point, m_dim*sizeof(*cv) );
    }
    break;

  case ON::intrinsic_point_style:
    k = m_is_rat?m_dim+1:m_dim;
    memcpy(cv,Point,k*sizeof(cv[0]));
    break;

  default:
    rc = false;
    break;
  }

  return rc;
}